

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::setState(FederateState *this,FederateStates newState)

{
  FederateStates __i;
  ulong in_RAX;
  FederateStates *__e;
  undefined7 uStack_8;
  FederateStates reqState;
  FederateStates reqState_1;
  
  if (((this->state)._M_i != newState) && (newState < UNKNOWN)) {
    switch(newState) {
    default:
      LOCK();
      (this->state)._M_i = newState;
      UNLOCK();
      return;
    case INITIALIZING:
      __e = &reqState_1;
      _uStack_8 = in_RAX & 0xffffffffffffff;
      __i = INITIALIZING;
      break;
    case EXECUTING:
      __e = &reqState;
      reqState_1 = (FederateStates)(in_RAX >> 0x38);
      uStack_8 = CONCAT16(1,(int6)in_RAX);
      __i = EXECUTING;
    }
    std::atomic<helics::FederateStates>::compare_exchange_strong(&this->state,__e,__i,seq_cst);
  }
  return;
}

Assistant:

void FederateState::setState(FederateStates newState)
{
    if (state == newState) {
        return;
    }
    switch (newState) {
        case FederateStates::ERRORED:
        case FederateStates::FINISHED:
        case FederateStates::CREATED:
        case FederateStates::TERMINATING:
            state = newState;
            break;
        case FederateStates::INITIALIZING: {
            auto reqState = FederateStates::CREATED;
            state.compare_exchange_strong(reqState, newState);
            break;
        }
        case FederateStates::EXECUTING: {
            auto reqState = FederateStates::INITIALIZING;
            state.compare_exchange_strong(reqState, newState);
            break;
        }
        case FederateStates::UNKNOWN:
        default:
            break;
    }
}